

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt__hheap_cleanup(stbtt__hheap *hh,void *userdata)

{
  stbtt__hheap_chunk *psVar1;
  stbtt__hheap_chunk *n;
  stbtt__hheap_chunk *c;
  void *userdata_local;
  stbtt__hheap *hh_local;
  
  n = hh->head;
  while (n != (stbtt__hheap_chunk *)0x0) {
    psVar1 = n->next;
    ImGui::MemFree(n);
    n = psVar1;
  }
  return;
}

Assistant:

static void stbtt__hheap_cleanup(stbtt__hheap *hh, void *userdata)
{
   stbtt__hheap_chunk *c = hh->head;
   while (c) {
      stbtt__hheap_chunk *n = c->next;
      STBTT_free(c, userdata);
      c = n;
   }
}